

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uct_node.cpp
# Opt level: O1

int __thiscall megumax::UCTNode::depth(UCTNode *this)

{
  int iVar1;
  
  iVar1 = -1;
  do {
    this = this->parent_;
    iVar1 = iVar1 + 1;
  } while (this != (UCTNode *)0x0);
  return iVar1;
}

Assistant:

int UCTNode::depth() const {
    const UCTNode* iter = this;
    int ply = 0;
    while (iter->parent_ != nullptr) {
        iter = iter->parent();
        ++ply;
    }
    return ply;
}